

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

Vec_Ptr_t * Saig_ManBmcSupergate(Aig_Man_t *p,int iPo)

{
  Vec_Ptr_t *vSuper;
  void **ppvVar1;
  void *pvVar2;
  
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 10;
  vSuper->nSize = 0;
  ppvVar1 = (void **)malloc(0x50);
  vSuper->pArray = ppvVar1;
  if ((-1 < iPo) && (iPo < p->vCos->nSize)) {
    pvVar2 = *(void **)((long)p->vCos->pArray[(uint)iPo] + 8);
    if ((((ulong)pvVar2 & 1) == 0) ||
       (pvVar2 = (void *)((ulong)pvVar2 & 0xfffffffffffffffe),
       (*(uint *)((long)pvVar2 + 0x18) & 7) - 7 < 0xfffffffe)) {
      vSuper->nSize = 1;
      *vSuper->pArray = pvVar2;
    }
    else {
      Saig_ManBmcSupergate_rec(*(Aig_Obj_t **)((long)pvVar2 + 8),vSuper);
      Saig_ManBmcSupergate_rec(*(Aig_Obj_t **)((long)pvVar2 + 0x10),vSuper);
    }
    return vSuper;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Saig_ManBmcSupergate( Aig_Man_t * p, int iPo )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    vSuper = Vec_PtrAlloc( 10 );
    pObj = Aig_ManCo( p, iPo );
    pObj = Aig_ObjChild0( pObj );
    if ( !Aig_IsComplement(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return vSuper;
    }
    pObj = Aig_Regular( pObj );
    if ( !Aig_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return vSuper;
    }
    Saig_ManBmcSupergate_rec( Aig_ObjChild0(pObj), vSuper );
    Saig_ManBmcSupergate_rec( Aig_ObjChild1(pObj), vSuper );
    return vSuper;
}